

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

group * clipp::operator_(group *__return_storage_ptr__,parameter *a,group *b)

{
  bool bVar1;
  __type _Var2;
  group *pgVar3;
  group gStack_1b8;
  group local_170;
  parameter local_128;
  
  pgVar3 = &gStack_1b8;
  if (b->scoped_ == false) {
    bVar1 = group::blocking(b);
    if ((((!bVar1) && (b->exclusive_ == false)) &&
        ((b->super_token<clipp::group>).repeatable_ == false)) && (b->joinable_ == false)) {
      if ((b->super_token<clipp::group>).doc_._M_string_length != 0) {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )b,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)a);
        if (!_Var2) goto LAB_00132f8d;
      }
      pgVar3 = group::push_front(b,a);
      bVar1 = false;
      goto LAB_00132fc9;
    }
  }
LAB_00132f8d:
  parameter::parameter(&local_128,a);
  group::group(&local_170,b);
  group::group<clipp::group>(&gStack_1b8,&local_128,&local_170);
  gStack_1b8.scoped_ = false;
  bVar1 = true;
LAB_00132fc9:
  group::group(__return_storage_ptr__,pgVar3);
  if (bVar1) {
    group::~group(&gStack_1b8);
    group::~group(&local_170);
    parameter::~parameter(&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator , (parameter a, group b)
{
    return !b.scoped() && !b.blocking() && !b.exclusive() && !b.repeatable()
        && !b.joinable() && (b.doc().empty() || b.doc() == a.doc())
       ? b.push_front(std::move(a))
       : group{std::move(a), std::move(b)}.scoped(false);
}